

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

void __thiscall miniros::master::Master::setupBindings(Master *this)

{
  RPCManager *pRVar1;
  allocator<char> local_31;
  string local_30;
  
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"registerPublisher",&local_31);
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)registerPublisher);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unregisterPublisher",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)unregisterPublisher);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"registerSubscriber",&local_31);
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)registerSubscriber);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unregisterSubscriber",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)unregisterSubscriber);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"getPublishedTopics",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)getPublishedTopics);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"getTopicTypes",&local_31);
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)getTopicTypes);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"getSystemState",&local_31);
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)getSystemState);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"lookupService",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)lookupService);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unregisterService",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)unregisterService);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"registerService",&local_31);
  RPCManager::
  bindEx4<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)registerService);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"lookupNode",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)lookupNode);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"hasParam",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)hasParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"setParam",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,XmlRpc::XmlRpcValue>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)setParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"getParam",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)getParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"deleteParam",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)deleteParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"searchParam",&local_31);
  RPCManager::bindEx2<miniros::master::Master,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)searchParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"subscribeParam",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)subscribeParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unsubscribeParam",&local_31);
  RPCManager::
  bindEx3<miniros::master::Master,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)unsubscribeParam);
  ::std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = (this->m_rpcManager).super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"getParamNames",&local_31);
  RPCManager::bindEx1<miniros::master::Master,std::__cxx11::string>
            (pRVar1,&local_30,this,(offset_in_Master_to_subr)getParamNames);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Master::setupBindings()
{
  // Core master part.
  m_rpcManager->bindEx4("registerPublisher", this, &Master::registerPublisher);
  m_rpcManager->bindEx3("unregisterPublisher", this, &Master::unregisterPublisher);
  m_rpcManager->bindEx4("registerSubscriber", this, &Master::registerSubscriber);
  m_rpcManager->bindEx3("unregisterSubscriber", this, &Master::unregisterSubscriber);
  m_rpcManager->bindEx2("getPublishedTopics", this, &Master::getPublishedTopics);
  m_rpcManager->bindEx1("getTopicTypes", this, &Master::getTopicTypes);
  m_rpcManager->bindEx1("getSystemState", this, &Master::getSystemState);

  m_rpcManager->bindEx2("lookupService", this, &Master::lookupService);
  m_rpcManager->bindEx3("unregisterService", this, &Master::unregisterService);
  m_rpcManager->bindEx4("registerService", this, &Master::registerService);
  m_rpcManager->bindEx2("lookupNode", this, &Master::lookupNode);

  // Rosparam part.
  m_rpcManager->bindEx2("hasParam", this, &Master::hasParam);
  m_rpcManager->bindEx3("setParam", this, &Master::setParam);
  m_rpcManager->bindEx2("getParam", this, &Master::getParam);
  m_rpcManager->bindEx2("deleteParam", this, &Master::deleteParam);
  m_rpcManager->bindEx2("searchParam", this, &Master::searchParam);
  m_rpcManager->bindEx3("subscribeParam", this, &Master::subscribeParam);
  m_rpcManager->bindEx3("unsubscribeParam", this, &Master::unsubscribeParam);
  m_rpcManager->bindEx1("getParamNames", this, &Master::getParamNames);
}